

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InitialLabelCase::iterate(InitialLabelCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  long *plVar7;
  NotSupportedError *this_00;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [8];
  int outlen;
  ScopedLogSection section;
  ResultCollector result;
  char buffer [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  undefined8 local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0;
  int local_2ac;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298 [2];
  string local_288;
  ScopedLogSection local_268;
  undefined8 local_260;
  code *local_258;
  int local_250;
  undefined1 local_248 [8];
  _func_int **local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [6];
  ios_base local_1d8 [8];
  ios_base local_1d0 [264];
  ResultCollector local_c8;
  char local_78;
  long lVar5;
  
  bVar2 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x758);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248 = (undefined1  [8])local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_c8,pTVar1,(string *)local_248);
  if (local_248 != (undefined1  [8])local_238) {
    operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
  }
  local_2ac = 0xffffffff;
  local_260 = (**(code **)(lVar5 + 0x640))(0x9117,0);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_2a8 = local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_288,&local_258);
    uVar11 = 0xf;
    if (local_2a8 != local_298) {
      uVar11 = local_298[0];
    }
    if (uVar11 < local_288._M_string_length + local_2a0) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        uVar12 = local_288.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_288._M_string_length + local_2a0) goto LAB_013d1080;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2a8);
    }
    else {
LAB_013d1080:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_288._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar9) {
      local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2e0._8_8_ = puVar6[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2e8 = puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    paVar9->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar9) {
      local_238[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_238[0]._8_8_ = puVar6[3];
      local_248 = (undefined1  [8])local_238;
    }
    else {
      local_238[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_248 = (undefined1  [8])*puVar6;
    }
    local_240 = (_func_int **)puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if (local_248 != (undefined1  [8])local_238) {
      operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
  }
  uVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_2a8 = local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_288,&local_258);
    uVar11 = 0xf;
    if (local_2a8 != local_298) {
      uVar11 = local_298[0];
    }
    if (uVar11 < local_288._M_string_length + local_2a0) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        uVar12 = local_288.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_288._M_string_length + local_2a0) goto LAB_013d12de;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2a8);
    }
    else {
LAB_013d12de:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_288._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar9) {
      local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2e0._8_8_ = puVar6[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2e8 = puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    paVar9->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar9) {
      local_238[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_238[0]._8_8_ = puVar6[3];
      local_248 = (undefined1  [8])local_238;
    }
    else {
      local_238[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_248 = (undefined1  [8])*puVar6;
    }
    local_240 = (_func_int **)puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if (local_248 != (undefined1  [8])local_238) {
      operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
  }
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248 = (undefined1  [8])local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Shader","");
  paVar9 = &local_2d0.field_2;
  local_2d0._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Shader object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_268,pTVar1,(string *)local_248,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar9) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (undefined1  [8])local_238) {
    operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_240,"Querying initial value",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
  std::ios_base::~ios_base(local_1d0);
  local_78 = 'X';
  local_2ac = -1;
  (**(code **)(lVar5 + 0x958))(0x82e1,uVar4,0x40);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_2a8 = local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_288,&local_258);
    uVar11 = 0xf;
    if (local_2a8 != local_298) {
      uVar11 = local_298[0];
    }
    if (uVar11 < local_288._M_string_length + local_2a0) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        uVar12 = local_288.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_288._M_string_length + local_2a0) goto LAB_013d1656;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2a8);
    }
    else {
LAB_013d1656:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_288._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2e0._8_8_ = puVar6[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2e8 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    paVar10->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_238[0]._8_8_ = puVar6[3];
      local_248 = (undefined1  [8])local_238;
    }
    else {
      local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_248 = (undefined1  [8])*puVar6;
    }
    local_240 = (_func_int **)puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if (local_248 != (undefined1  [8])local_238) {
      operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar9) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
  }
  if (local_2ac == 0) {
    if (local_78 == '\0') {
      local_248 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_240,"Got 0-sized null-terminated string.",0x23);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
      std::ios_base::~ios_base(local_1d0);
    }
    else {
      local_248 = (undefined1  [8])local_238;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"label was not null terminated","");
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      uVar12 = local_238[0]._M_allocated_capacity;
      auVar13 = local_248;
      if (local_248 != (undefined1  [8])local_238) goto LAB_013d1956;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
    std::ostream::operator<<(local_248,local_2ac);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
    std::ios_base::~ios_base(local_1d8);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x1c6f888);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar9) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2e0._M_allocated_capacity;
    auVar13 = (undefined1  [8])local_2f0;
    if (local_2f0 != &local_2e0) {
LAB_013d1956:
      operator_delete((void *)auVar13,uVar12 + 1);
    }
  }
  tcu::TestLog::endSection(local_268.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248 = (undefined1  [8])local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Sync","");
  local_2d0._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Sync object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_268,pTVar1,(string *)local_248,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar9) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (undefined1  [8])local_238) {
    operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_240,"Querying initial value",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
  std::ios_base::~ios_base(local_1d0);
  local_78 = 'X';
  local_2ac = -1;
  (**(code **)(lVar5 + 0x960))(local_260,0x40);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 != 0) {
    local_2a8 = local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Got Error ","");
    local_258 = glu::getErrorName;
    local_250 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_288,&local_258);
    uVar11 = 0xf;
    if (local_2a8 != local_298) {
      uVar11 = local_298[0];
    }
    if (uVar11 < local_288._M_string_length + local_2a0) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        uVar12 = local_288.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_288._M_string_length + local_2a0) goto LAB_013d1b8a;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2a8);
    }
    else {
LAB_013d1b8a:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_288._M_dataplus._M_p)
      ;
    }
    local_2f0 = &local_2e0;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2e0._8_8_ = puVar6[3];
    }
    else {
      local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2e8 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    paVar10->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_238[0]._8_8_ = puVar6[3];
      local_248 = (undefined1  [8])local_238;
    }
    else {
      local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_248 = (undefined1  [8])*puVar6;
    }
    local_240 = (_func_int **)puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if (local_248 != (undefined1  [8])local_238) {
      operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar9) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
  }
  if (local_2ac == 0) {
    if (local_78 == '\0') {
      local_248 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_240,"Got 0-sized null-terminated string.",0x23);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
      std::ios_base::~ios_base(local_1d0);
      goto LAB_013d1ef5;
    }
    local_248 = (undefined1  [8])local_238;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"label was not null terminated","");
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    uVar12 = local_238[0]._M_allocated_capacity;
    auVar13 = local_248;
    if (local_248 == (undefined1  [8])local_238) goto LAB_013d1ef5;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
    std::ostream::operator<<(local_248,local_2ac);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
    std::ios_base::~ios_base(local_1d8);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x1c6f888);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar8;
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar9) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_2e0._M_allocated_capacity;
    auVar13 = (undefined1  [8])local_2f0;
    if (local_2f0 == &local_2e0) goto LAB_013d1ef5;
  }
  operator_delete((void *)auVar13,uVar12 + 1);
LAB_013d1ef5:
  tcu::TestLog::endSection(local_268.m_log);
  (**(code **)(lVar5 + 0x470))(uVar4);
  (**(code **)(lVar5 + 0x478))(local_260);
  tcu::ResultCollector::setTestContextResult
            (&local_c8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
    operator_delete(local_c8.m_message._M_dataplus._M_p,
                    local_c8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_prefix._M_dataplus._M_p != &local_c8.m_prefix.field_2) {
    operator_delete(local_c8.m_prefix._M_dataplus._M_p,
                    local_c8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

InitialLabelCase::IterateResult InitialLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");
		m_testCtx.getLog() << TestLog::Message << "Querying initial value" << TestLog::EndMessage;

		buffer[0] = 'X';
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");
		m_testCtx.getLog() << TestLog::Message << "Querying initial value" << TestLog::EndMessage;

		buffer[0] = 'X';
		outlen = -1;
		gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}